

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::PoolingLayerParams::InternalSwap
          (PoolingLayerParams *this,PoolingLayerParams *other)

{
  int iVar1;
  uint32_t uVar2;
  intptr_t iVar3;
  PoolingPaddingTypeUnion PVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  LogMessage *pLVar12;
  LogFinisher local_89;
  LogMessage local_88;
  LogMessage local_50;
  
  iVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar3;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_88,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar7 = (this->kernelsize_).current_size_;
  iVar8 = (this->kernelsize_).total_size_;
  pvVar5 = (this->kernelsize_).arena_or_elements_;
  iVar1 = (other->kernelsize_).total_size_;
  pvVar6 = (other->kernelsize_).arena_or_elements_;
  (this->kernelsize_).current_size_ = (other->kernelsize_).current_size_;
  (this->kernelsize_).total_size_ = iVar1;
  (this->kernelsize_).arena_or_elements_ = pvVar6;
  (other->kernelsize_).current_size_ = iVar7;
  (other->kernelsize_).total_size_ = iVar8;
  (other->kernelsize_).arena_or_elements_ = pvVar5;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_88,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    pLVar12 = google::protobuf::internal::LogMessage::operator<<
                        (&local_88,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_89,pLVar12);
    google::protobuf::internal::LogMessage::~LogMessage(&local_88);
  }
  iVar7 = (this->stride_).current_size_;
  iVar8 = (this->stride_).total_size_;
  pvVar5 = (this->stride_).arena_or_elements_;
  iVar1 = (other->stride_).total_size_;
  pvVar6 = (other->stride_).arena_or_elements_;
  (this->stride_).current_size_ = (other->stride_).current_size_;
  (this->stride_).total_size_ = iVar1;
  (this->stride_).arena_or_elements_ = pvVar6;
  (other->stride_).current_size_ = iVar7;
  (other->stride_).total_size_ = iVar8;
  (other->stride_).arena_or_elements_ = pvVar5;
  iVar1 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar1;
  bVar10 = this->avgpoolexcludepadding_;
  bVar11 = this->globalpooling_;
  bVar9 = other->globalpooling_;
  this->avgpoolexcludepadding_ = other->avgpoolexcludepadding_;
  this->globalpooling_ = bVar9;
  other->avgpoolexcludepadding_ = bVar10;
  other->globalpooling_ = bVar11;
  PVar4 = this->PoolingPaddingType_;
  this->PoolingPaddingType_ = other->PoolingPaddingType_;
  other->PoolingPaddingType_ = PVar4;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  return;
}

Assistant:

void PoolingLayerParams::InternalSwap(PoolingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(PoolingLayerParams, globalpooling_)
      + sizeof(PoolingLayerParams::globalpooling_)
      - PROTOBUF_FIELD_OFFSET(PoolingLayerParams, type_)>(
          reinterpret_cast<char*>(&type_),
          reinterpret_cast<char*>(&other->type_));
  swap(PoolingPaddingType_, other->PoolingPaddingType_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}